

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modifiers.cpp
# Opt level: O1

void __thiscall Modifiers_Init_Test::TestBody(Modifiers_Init_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  AssertionResult gtest_ar_1;
  opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  opt_b;
  opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  opt_a;
  AssertHelper local_198;
  Message local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  AssertHelper local_180;
  undefined1 local_178 [8];
  const_iterator local_170;
  enumeration local_f0 [2];
  undefined **local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  option local_c8;
  enumeration local_40 [2];
  undefined **local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  pstore::command_line::option::option(&local_c8);
  local_c8._vptr_option = (_func_int **)&PTR__opt_001ae590;
  local_40[0] = a;
  local_30 = 0;
  uStack_28 = 0;
  local_20 = 0;
  local_38 = &PTR__parser_001ae648;
  local_190.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::EqHelper::
  Compare<(anonymous_namespace)::enumeration,_(anonymous_namespace)::enumeration,_nullptr>
            ((EqHelper *)local_178,"opt_a.get ()","enumeration::a",local_40,
             (enumeration *)&local_190);
  if (local_178[0] == (EqHelper)0x0) {
    testing::Message::Message(&local_190);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._M_node ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)&(local_170._M_node)->_M_next)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_modifiers.cpp"
               ,0x39,pcVar1);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if ((long *)CONCAT44(local_190.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_190.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_190.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_190.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170._M_node !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_170._M_node);
  }
  pstore::command_line::option::option((option *)local_178);
  local_178 = (undefined1  [8])&PTR__opt_001ae590;
  local_e0 = 0;
  uStack_d8 = 0;
  local_d0 = 0;
  local_e8 = &PTR__parser_001ae648;
  local_f0[0] = b;
  local_198.data_._0_4_ = 1;
  testing::internal::EqHelper::
  Compare<(anonymous_namespace)::enumeration,_(anonymous_namespace)::enumeration,_nullptr>
            ((EqHelper *)&local_190,"opt_b.get ()","enumeration::b",local_f0,
             (enumeration *)&local_198);
  if (local_190.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (EqHelper)0x0) {
    testing::Message::Message((Message *)&local_198);
    if (local_188 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_188->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_modifiers.cpp"
               ,0x3c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if ((long *)CONCAT44(local_198.data_._4_4_,local_198.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_198.data_._4_4_,local_198.data_._0_4_) + 8))();
    }
  }
  if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_188,local_188);
  }
  pstore::command_line::parser<std::__cxx11::string,void>::~parser
            ((parser<std::__cxx11::string,void> *)&local_e8);
  pstore::command_line::option::~option((option *)local_178);
  pstore::command_line::parser<std::__cxx11::string,void>::~parser
            ((parser<std::__cxx11::string,void> *)&local_38);
  pstore::command_line::option::~option(&local_c8);
  return;
}

Assistant:

TEST_F (Modifiers, Init) {
    // init() allows the initial (default) value of the option to be described.
    opt<enumeration> opt_a (init (enumeration::a));

    EXPECT_EQ (opt_a.get (), enumeration::a);

    opt<enumeration> opt_b (init (enumeration::b));
    EXPECT_EQ (opt_b.get (), enumeration::b);
}